

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg3.cc
# Opt level: O1

void __thiscall trng::mrg3::seed(mrg3 *this,result_type s1,result_type s2,result_type s3)

{
  int iVar1;
  int iVar2;
  
  iVar1 = (int)((long)s1 * 0x40000001 >> 0x3d) - (s1 >> 0x1f);
  iVar2 = iVar1 * -0x80000000 + s1 + iVar1;
  iVar1 = iVar2 + 0x7fffffff;
  if (-1 < iVar2) {
    iVar1 = iVar2;
  }
  (this->S).r[0] = iVar1;
  iVar2 = s2 + ((int)((long)s2 * 0x40000001 >> 0x3d) - (s2 >> 0x1f)) * -0x7fffffff;
  iVar1 = iVar2 + 0x7fffffff;
  if (-1 < iVar2) {
    iVar1 = iVar2;
  }
  (this->S).r[1] = iVar1;
  iVar2 = s3 + ((int)((long)s3 * 0x40000001 >> 0x3d) - (s3 >> 0x1f)) * -0x7fffffff;
  iVar1 = iVar2 + 0x7fffffff;
  if (-1 < iVar2) {
    iVar1 = iVar2;
  }
  (this->S).r[2] = iVar1;
  return;
}

Assistant:

void mrg3::seed(mrg3::result_type s1, mrg3::result_type s2, mrg3::result_type s3) {
    S.r[0] = s1 % modulus;
    if (S.r[0] < 0)
      S.r[0] += modulus;
    S.r[1] = s2 % modulus;
    if (S.r[1] < 0)
      S.r[1] += modulus;
    S.r[2] = s3 % modulus;
    if (S.r[2] < 0)
      S.r[2] += modulus;
  }